

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O3

bool __thiscall LEFReader::parseSymmetry(LEFReader *this)

{
  token_t tVar1;
  string symmetry;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  tVar1 = tokenize(this,&this->m_tokstr);
  while (this->m_curtok = tVar1, tVar1 != TOK_SEMICOL) {
    std::__cxx11::string::_M_append((char *)&local_48,(ulong)(this->m_tokstr)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_48);
    tVar1 = tokenize(this,&this->m_tokstr);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return true;
}

Assistant:

bool LEFReader::parseSymmetry()
{
    // SYMMETRY (X|Y|R90)+ ';' 

    
    std::string symmetry;

    // read options until we get to the semicolon.
    m_curtok = tokenize(m_tokstr);
    while(m_curtok!= TOK_SEMICOL)
    {
        symmetry += m_tokstr;
        symmetry += " ";
        m_curtok = tokenize(m_tokstr);
    }

    //std::cout << "  SYMMETRY " << symmetry << "\n";

    return true;
}